

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.h
# Opt level: O0

DEdgeVec * libDAI::MinSpanningTreePrims<double>(WeightedGraph<double> *Graph)

{
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  last;
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  size_type sVar4;
  reference pvVar5;
  reference __b;
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar6;
  bool e1_in_tree;
  size_t e_1;
  size_t N;
  size_t i;
  size_t root;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  boostGraph g;
  const_iterator e;
  vector<double,_std::allocator<double>_> weights;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  edges;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> nodes;
  DEdgeVec *result;
  value_type *in_stack_fffffffffffffde8;
  value_type *__x;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  reference in_stack_fffffffffffffdf8;
  allocator_type *in_stack_fffffffffffffe00;
  value_type_conflict2 *in_stack_fffffffffffffe08;
  size_type sVar7;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe20;
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *this;
  edges_size_type in_stack_fffffffffffffe28;
  undefined1 *n;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_fffffffffffffe50;
  pointer in_stack_fffffffffffffe60;
  size_type local_178;
  size_type local_170;
  DEdge local_168;
  size_type local_158;
  size_type local_150;
  undefined1 local_141 [32];
  undefined1 local_121 [17];
  pair<unsigned_long,_unsigned_long> *local_110;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<unsigned_long,_unsigned_long> local_a8;
  _Self local_98;
  _Self local_90 [6];
  undefined1 local_60 [79];
  undefined1 local_11;
  
  local_11 = 0;
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::vector
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)0xb9cf47);
  sVar2 = std::
          map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
          ::size((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  *)0xb9cf54);
  if (sVar2 != 0) {
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0xb9cf6b);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)0xb9cf80);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0xb9cf8d);
    std::
    map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ::size((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            *)0xb9cf9a);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::
    map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ::size((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            *)0xb9cfb9);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
         ::begin((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  *)in_stack_fffffffffffffde8);
    while( true ) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
           ::end((map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                  *)in_stack_fffffffffffffde8);
      bVar1 = std::operator!=(local_90,&local_98);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_> *)0xb9d020);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00,
                 (value_type_conflict3 *)in_stack_fffffffffffffdf8);
      in_stack_fffffffffffffe60 =
           std::_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator->
                     ((_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_> *)0xb9d048);
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_> *)
                          0xb9d057);
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
                (&local_a8,(unsigned_long *)in_stack_fffffffffffffe60,&(ppVar3->first).n2);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                  in_stack_fffffffffffffde8);
      std::_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_> *)0xb9d096);
      pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe50._M_current =
           (pair<unsigned_long,_unsigned_long> *)pVar6.first._M_node;
      in_stack_fffffffffffffe4f = pVar6.second;
      local_b8 = (_Base_ptr)in_stack_fffffffffffffe50._M_current;
      local_b0 = in_stack_fffffffffffffe4f;
      std::_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_> *)0xb9d0d6);
      pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe40._M_current = (double *)pVar6.first._M_node;
      in_stack_fffffffffffffe3f = pVar6.second;
      local_c8 = (_Base_ptr)in_stack_fffffffffffffe40._M_current;
      local_c0 = in_stack_fffffffffffffe3f;
      local_d0 = (_Base_ptr)
                 std::_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator++
                           ((_Rb_tree_const_iterator<std::pair<const_libDAI::UEdge,_double>_> *)
                            in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    }
    n = local_60;
    local_110 = (pair<unsigned_long,_unsigned_long> *)
                std::
                vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffde8);
    local_121._9_8_ =
         std::
         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)in_stack_fffffffffffffde8);
    local_121._1_8_ =
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde8);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0xb9d190);
    __x = (value_type *)local_121;
    last._M_current._7_1_ = in_stack_fffffffffffffe4f;
    last._M_current._0_7_ = in_stack_fffffffffffffe48;
    boost::
    adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>
    ::
    adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe50,last,in_stack_fffffffffffffe40,(vertices_size_type)n,
               in_stack_fffffffffffffe28,(no_property *)in_stack_fffffffffffffe60);
    boost::
    num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
              ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                *)in_stack_fffffffffffffe00);
    this = (vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)local_141;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb9d1f3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10,
               (size_type)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb9d219);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_141 + 1),0);
    boost::
    prim_minimum_spanning_tree<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,unsigned_long*>
              ((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                *)in_stack_fffffffffffffe40._M_current,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0xb9d249);
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::reserve
              (this,in_stack_fffffffffffffe18);
    local_150 = 0;
    local_158 = 0;
    while (sVar7 = local_158,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (local_141 + 1)), sVar7 != sVar4) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_141 + 1),
                          local_158);
      if (*pvVar5 == local_158) {
        local_150 = local_158;
      }
      else {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_141 + 1)
                            ,local_158);
        DEdge::DEdge(&local_168,*pvVar5,local_158);
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back
                  ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),__x);
      }
      local_158 = local_158 + 1;
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),&__x->n1);
    local_170 = 0;
LAB_00b9d3c2:
    sVar7 = local_170;
    sVar4 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size(in_RDI);
    if (sVar7 != sVar4) {
      local_178 = local_170;
      while (sVar7 = local_178,
            sVar4 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size(in_RDI),
            sVar7 != sVar4) {
        std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[](in_RDI,local_178);
        in_stack_fffffffffffffe00 =
             (allocator_type *)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->n1);
        if (in_stack_fffffffffffffe00 == (allocator_type *)0x0) {
          std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[](in_RDI,local_178);
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),&__x->n1);
          in_stack_fffffffffffffdf8 =
               std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                         (in_RDI,local_170);
          __b = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                          (in_RDI,local_178);
          std::swap<libDAI::DEdge>(in_stack_fffffffffffffdf8,__b);
          local_170 = local_170 + 1;
          break;
        }
        local_178 = local_178 + 1;
      }
      goto LAB_00b9d3c2;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe00);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
    ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                       *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)in_stack_fffffffffffffe00);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0xb9d553);
  }
  return in_RDI;
}

Assistant:

DEdgeVec MinSpanningTreePrims( const WeightedGraph<T> & Graph ) {
        DEdgeVec result;
        if( Graph.size() > 0 ) {
            using namespace boost;
            using namespace std;
            typedef adjacency_list< vecS, vecS, undirectedS, property<vertex_distance_t, int>, property<edge_weight_t, double> > boostGraph;
            typedef pair<size_t, size_t> E;

            set<size_t> nodes;
            vector<E> edges;
            vector<double> weights;
            edges.reserve( Graph.size() );
            weights.reserve( Graph.size() );
            for( typename WeightedGraph<T>::const_iterator e = Graph.begin(); e != Graph.end(); e++ ) {
                weights.push_back( e->second );
                edges.push_back( E( e->first.n1, e->first.n2 ) );
                nodes.insert( e->first.n1 );
                nodes.insert( e->first.n2 );
            }

            boostGraph g( edges.begin(), edges.end(), weights.begin(), nodes.size() );
            vector< graph_traits< boostGraph >::vertex_descriptor > p( num_vertices(g) );
            prim_minimum_spanning_tree( g, &(p[0]) );

            // Store tree edges in result
            result.reserve( nodes.size() - 1 );
            size_t root = 0;
            for( size_t i = 0; i != p.size(); i++ )
                if( p[i] != i )
                    result.push_back( DEdge( p[i], i ) );
                else
                    root = i;

            // We have to store the minimum spanning tree in the right
            // order, such that for all (i1, j1), (i2, j2) in result,
            // if j1 == i2 then (i1, j1) comes before (i2, j2) in result.
            // We do this by reordering the contents of result, effectively
            // growing the tree starting at the root. At each step, 
            // result[0..N-1] are the edges already added to the tree,
            // whereas the other elements of result still have to be added.
            // The elements of nodes are the vertices that still have to
            // be added to the tree.

            // Start with the root
            nodes.erase( root );
            size_t N = 0;

            // Iteratively add edges and nodes to the growing tree
            while( N != result.size() ) {
                for( size_t e = N; e != result.size(); e++ ) {
                    bool e1_in_tree = !nodes.count( result[e].n1 );
                    if( e1_in_tree ) {
                        nodes.erase( result[e].n2 );
                        swap( result[N], result[e] );
                        N++;
                        break;
                    }
                }
            }
        }

        return result;
    }